

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename_absolute.cxx
# Opt level: O3

int fl_filename_relative(char *to,int tolen,char *from)

{
  int iVar1;
  char *pcVar2;
  char cwd_buf [2048];
  char acStack_818 [2048];
  
  pcVar2 = fl_getcwd(acStack_818,0x800);
  if (pcVar2 == (char *)0x0) {
    fl_strlcpy(to,from,(long)tolen);
    iVar1 = 0;
  }
  else {
    iVar1 = fl_filename_relative(to,tolen,from,acStack_818);
  }
  return iVar1;
}

Assistant:

int					// O - 0 if no change, 1 if changed
fl_filename_relative(char       *to,	// O - Relative filename
                     int        tolen,	// I - Size of "to" buffer
                     const char *from)  // I - Absolute filename
{
  char cwd_buf[FL_PATH_MAX];	// Current directory
  // get the current directory and return if we can't
  if (!fl_getcwd(cwd_buf, sizeof(cwd_buf))) {
    strlcpy(to, from, tolen);
    return 0;
  }
  return fl_filename_relative(to, tolen, from, cwd_buf);
}